

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format_duration.cpp
# Opt level: O2

void __thiscall milliseconds::test_method(milliseconds *this)

{
  duration *time;
  duration *time_00;
  duration *time_01;
  undefined **local_108;
  undefined1 local_100;
  undefined8 *local_f8;
  char *local_f0;
  undefined8 local_e8;
  string local_e0;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1d);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0010bc60;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_98 = "";
  local_e8 = 1000000;
  perf::format_duration_abi_cxx11_(&local_e0,(perf *)&local_e8,time);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_108,&local_a0,0x1d,1,2,&local_e0,"perf::format_duration(perf::milliseconds(1))",
             "1 ms","\"1 ms\"");
  std::__cxx11::string::~string((string *)&local_e0);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x1e);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0010bc60;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_a8 = "";
  local_e8 = 1000000;
  perf::format_duration_abi_cxx11_(&local_e0,(perf *)&local_e8,time_00);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_108,&local_b0,0x1e,1,2,&local_e0,
             "perf::format_duration(perf::microseconds(1000))","1 ms","\"1 ms\"");
  std::__cxx11::string::~string((string *)&local_e0);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x1f);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_0010bc60;
  local_f8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
  ;
  local_b8 = "";
  local_e8 = 2000000;
  perf::format_duration_abi_cxx11_(&local_e0,(perf *)&local_e8,time_01);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
            (&local_108,&local_c0,0x1f,1,2,&local_e0,
             "perf::format_duration(perf::microseconds(2000))","2 ms","\"2 ms\"");
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(milliseconds)
{
    BOOST_CHECK_EQUAL(perf::format_duration(perf::milliseconds(1)), "1 ms");
    BOOST_CHECK_EQUAL(perf::format_duration(perf::microseconds(1000)), "1 ms");
    BOOST_CHECK_EQUAL(perf::format_duration(perf::microseconds(2000)), "2 ms");
}